

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_nullddi.cpp
# Opt level: O3

ze_result_t
driver::zesOverclockGetControlState
          (zes_overclock_handle_t hDomainHandle,zes_overclock_control_t DomainControl,
          zes_control_state_t *pControlState,zes_pending_action_t *pPendingAction)

{
  ze_result_t zVar1;
  
  if (DAT_0010eb00 != (code *)0x0) {
    zVar1 = (*DAT_0010eb00)();
    return zVar1;
  }
  return ZE_RESULT_SUCCESS;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesOverclockGetControlState(
        zes_overclock_handle_t hDomainHandle,           ///< [in] Handle for the component domain.
        zes_overclock_control_t DomainControl,          ///< [in] Domain Control.
        zes_control_state_t* pControlState,             ///< [out] Current overclock control state.
        zes_pending_action_t* pPendingAction            ///< [out] Pending overclock setting.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGetControlState = context.zesDdiTable.Overclock.pfnGetControlState;
        if( nullptr != pfnGetControlState )
        {
            result = pfnGetControlState( hDomainHandle, DomainControl, pControlState, pPendingAction );
        }
        else
        {
            // generic implementation
        }

        return result;
    }